

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlEntityPtr xmlGetPredefinedEntity(xmlChar *name)

{
  byte bVar1;
  int iVar2;
  
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  bVar1 = *name;
  if (bVar1 < 0x6c) {
    if (bVar1 == 0x61) {
      iVar2 = xmlStrEqual(name,"amp");
      if (iVar2 != 0) {
        return &xmlEntityAmp;
      }
      iVar2 = xmlStrEqual(name,(xmlChar *)"apos");
      if (iVar2 != 0) {
        return &xmlEntityApos;
      }
    }
    else if ((bVar1 == 0x67) && (iVar2 = xmlStrEqual(name,(xmlChar *)"gt"), iVar2 != 0)) {
      return &xmlEntityGt;
    }
  }
  else if (bVar1 == 0x71) {
    iVar2 = xmlStrEqual(name,(xmlChar *)"quot");
    if (iVar2 != 0) {
      return &xmlEntityQuot;
    }
  }
  else if ((bVar1 == 0x6c) && (iVar2 = xmlStrEqual(name,"lt"), iVar2 != 0)) {
    return &xmlEntityLt;
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlGetPredefinedEntity(const xmlChar *name) {
    if (name == NULL) return(NULL);
    switch (name[0]) {
        case 'l':
	    if (xmlStrEqual(name, BAD_CAST "lt"))
	        return(&xmlEntityLt);
	    break;
        case 'g':
	    if (xmlStrEqual(name, BAD_CAST "gt"))
	        return(&xmlEntityGt);
	    break;
        case 'a':
	    if (xmlStrEqual(name, BAD_CAST "amp"))
	        return(&xmlEntityAmp);
	    if (xmlStrEqual(name, BAD_CAST "apos"))
	        return(&xmlEntityApos);
	    break;
        case 'q':
	    if (xmlStrEqual(name, BAD_CAST "quot"))
	        return(&xmlEntityQuot);
	    break;
	default:
	    break;
    }
    return(NULL);
}